

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

_Bool rf_gfx_render_texture_complete(rf_render_texture2d target)

{
  uint uVar1;
  char *pcVar2;
  uint in_stack_00000008;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,in_stack_00000008);
  uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.CheckFramebufferStatus)(0x8d40);
  if (uVar1 == 0x8cd6) {
    pcVar2 = "Framebuffer has incomplete attachment";
  }
  else if (uVar1 == 0x8cd7) {
    pcVar2 = "Framebuffer has a missing attachment";
  }
  else {
    if (uVar1 != 0x8cdd) goto LAB_00155014;
    pcVar2 = "Framebuffer is unsupported";
  }
  rf_log_impl(4,(rf_log_type)pcVar2);
LAB_00155014:
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,0);
  return uVar1 == 0x8cd5;
}

Assistant:

RF_API bool rf_gfx_render_texture_complete(rf_render_texture2d target)
{
    bool result = false;

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, target.id);

    unsigned int status = rf_gl.CheckFramebufferStatus(GL_FRAMEBUFFER);

    if (status != GL_FRAMEBUFFER_COMPLETE)
    {
        switch (status)
        {
            case GL_FRAMEBUFFER_UNSUPPORTED: RF_LOG(RF_LOG_TYPE_WARNING, "Framebuffer is unsupported"); break;
            case GL_FRAMEBUFFER_INCOMPLETE_ATTACHMENT: RF_LOG(RF_LOG_TYPE_WARNING, "Framebuffer has incomplete attachment"); break;

            #if defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
            case GL_FRAMEBUFFER_INCOMPLETE_DIMENSIONS: RF_LOG(RF_LOG_TYPE_WARNING, "Framebuffer has incomplete dimensions"); break;
            #endif

            case GL_FRAMEBUFFER_INCOMPLETE_MISSING_ATTACHMENT: RF_LOG(RF_LOG_TYPE_WARNING, "Framebuffer has a missing attachment"); break;
            default: break;
        }
    }

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, 0);

    result = (status == GL_FRAMEBUFFER_COMPLETE);

    return result;
}